

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O2

void do_pktrack(CHAR_DATA *ch,char *argument)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  BUFFER *buffer;
  char *pcVar5;
  MYSQL *pMVar6;
  long lVar7;
  undefined8 *puVar8;
  int iVar9;
  char *__format;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string query;
  char *local_3648 [2];
  char qpart [4608];
  char arg1 [4608];
  char buf [4608];
  
  bVar3 = str_cmp(argument,"");
  if (!bVar3) {
    send_to_char("Syntax: pktrack <wins/losses/all/date/location> <value>\n\r",ch);
    return;
  }
  buffer = new_buf();
  pcVar5 = one_argument(argument,arg1);
  bVar3 = str_cmp(arg1,"wins");
  if (bVar3) {
    bVar3 = str_cmp(arg1,"losses");
    if (!bVar3) {
      __format = "victim RLIKE \'%s\'";
      goto LAB_00328831;
    }
    bVar3 = str_cmp(arg1,"all");
    if (bVar3) {
      bVar3 = str_cmp(arg1,"date");
      if (bVar3) {
        bVar3 = str_cmp(arg1,"location");
        if (bVar3) {
          send_to_char("Invalid option.\n\r",ch);
          return;
        }
        __format = "room RLIKE \'%s\'";
      }
      else {
        __format = "date RLIKE \'%s\'";
      }
      goto LAB_00328831;
    }
    sprintf(qpart,"killer RLIKE \'%s\' OR victim RLIKE \'%s\'",pcVar5,pcVar5);
  }
  else {
    __format = "killer RLIKE \'%s\'";
LAB_00328831:
    sprintf(qpart,__format,pcVar5);
  }
  local_3648[0] = qpart;
  fmt.size_ = 0xc;
  fmt.data_ = (char *)0x1d;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_3648;
  ::fmt::v9::vformat_abi_cxx11_(&query,(v9 *)"SELECT * FROM pklogs WHERE {}",fmt,args);
  pMVar6 = open_conn();
  mysql_query(pMVar6,query._M_dataplus._M_p);
  lVar7 = mysql_store_result(pMVar6);
  if (lVar7 == 0) {
    iVar9 = mysql_field_count(pMVar6);
    if (iVar9 != 0) {
      send_to_char("Error accessing results.\n\r",ch);
    }
  }
  else {
    iVar9 = 1;
    bVar3 = false;
    while (puVar8 = (undefined8 *)mysql_fetch_row(lVar7), puVar8 != (undefined8 *)0x0) {
      uVar1 = *puVar8;
      iVar4 = atoi((char *)puVar8[1]);
      pcVar5 = cabal_table[iVar4].name;
      uVar2 = puVar8[2];
      iVar4 = atoi((char *)puVar8[3]);
      sprintf(buf,"%3d) %s(%s) killed %s(%s) at %s on %s\n\r",iVar9,uVar1,pcVar5,uVar2,
              cabal_table[iVar4].name,puVar8[5],puVar8[4]);
      iVar9 = iVar9 + 1;
      bVar3 = true;
      add_buf(buffer,buf);
    }
    if (!bVar3) {
      send_to_char("No matching results found.\n\r",ch);
      goto LAB_003289a8;
    }
    mysql_free_result(lVar7);
    pcVar5 = buf_string(buffer);
    page_to_char(pcVar5,ch);
    free_buf(buffer);
  }
  mysql_close(pMVar6);
LAB_003289a8:
  std::__cxx11::string::~string((string *)&query);
  return;
}

Assistant:

void do_pktrack(CHAR_DATA *ch, char *argument)
{
	MYSQL *conn;
	MYSQL_ROW row;
	MYSQL_RES *res_set;
	BUFFER *buffer;
	char arg1[MSL], qpart[MSL], buf[MSL];
	int i = 0;
	bool found= false;

	if (!str_cmp(argument, ""))
	{
		send_to_char("Syntax: pktrack <wins/losses/all/date/location> <value>\n\r", ch);
		return;
	}

	buffer = new_buf();
	argument = one_argument(argument, arg1);

	if (!str_cmp(arg1, "wins"))
	{
		sprintf(qpart, "killer RLIKE '%s'", argument);
	}
	else if (!str_cmp(arg1, "losses"))
	{
		sprintf(qpart, "victim RLIKE '%s'", argument);
	}
	else if (!str_cmp(arg1, "all"))
	{
		sprintf(qpart, "killer RLIKE '%s' OR victim RLIKE '%s'", argument, argument);
	}
	else if (!str_cmp(arg1, "date"))
	{
		sprintf(qpart, "date RLIKE '%s'", argument);
	}
	else if (!str_cmp(arg1, "location"))
	{
		sprintf(qpart, "room RLIKE '%s'", argument);
	}
	else
	{
		send_to_char("Invalid option.\n\r", ch);
		return;
	}

	auto query = fmt::format("SELECT * FROM pklogs WHERE {}", qpart);
	conn = open_conn();
	mysql_query(conn, query.c_str());
	res_set = mysql_store_result(conn);

	if (res_set == nullptr && mysql_field_count(conn) > 0)
	{
		send_to_char("Error accessing results.\n\r", ch);
	}
	else if (res_set)
	{
		while ((row = mysql_fetch_row(res_set)) != nullptr)
		{
			sprintf(buf, "%3d) %s(%s) killed %s(%s) at %s on %s\n\r",
				++i,
				row[0],
				cabal_table[atoi(row[1])].name,
				row[2],
				cabal_table[atoi(row[3])].name, row[5],
				row[4]);

			add_buf(buffer, buf);
			found = true;
		}

		if (!found)
		{
			send_to_char("No matching results found.\n\r", ch);
			return;
		}

		mysql_free_result(res_set);
		page_to_char(buf_string(buffer), ch);
		free_buf(buffer);
	}

	mysql_close(conn);
}